

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O3

bool __thiscall
duckdb::QueryResultChunkScanState::LoadNextChunk(QueryResultChunkScanState *this,ErrorData *error)

{
  bool bVar1;
  byte bVar2;
  
  if ((this->super_ChunkScanState).finished == false) {
    bVar1 = InternalLoad(this,error);
    if (bVar1) {
      bVar2 = (this->super_ChunkScanState).finished ^ 1;
    }
    else {
      (this->super_ChunkScanState).finished = true;
      bVar2 = 0;
    }
    (this->super_ChunkScanState).offset = 0;
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QueryResultChunkScanState::LoadNextChunk(ErrorData &error) {
	if (finished) {
		return !finished;
	}
	auto load_result = InternalLoad(error);
	if (!load_result) {
		finished = true;
	}
	offset = 0;
	return !finished;
}